

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

_Bool ScanValue(ConfigScanner *sc)

{
  byte bVar1;
  _Bool _Var2;
  char *pcVar3;
  
  if (sc == (ConfigScanner *)0x0) {
    return false;
  }
  bVar1 = *sc->ptr;
  if (bVar1 < 0x2d) {
    if (bVar1 == 0x22) {
      sc->ptr = sc->ptr + 1;
      pcVar3 = GetQuote(sc);
      if (pcVar3 == (char *)0x0) {
        return false;
      }
      sc->current_string = pcVar3;
      sc->vtype = VTYPE_STRING;
      return true;
    }
    if (bVar1 != 0x2b) goto LAB_00142b4b;
  }
  else if (bVar1 != 0x2d) {
    if ((bVar1 == 0x66) || (bVar1 == 0x74)) {
      _Var2 = ScanBoolean(sc);
      goto LAB_00142b59;
    }
LAB_00142b4b:
    if (9 < (byte)(bVar1 - 0x30)) {
      return false;
    }
  }
  _Var2 = ScanNumber(sc);
LAB_00142b59:
  if (_Var2 == false) {
    return false;
  }
  return true;
}

Assistant:

bool ScanValue(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return false;
	}
	char ch = *sc->ptr;
	if (ch == '"')
	{
		sc->ptr++;
		char *value = GetQuote(sc);
		if (value == NULL)
		{
			return false;
		}
		sc->current_string = value;
		sc->vtype = VTYPE_STRING;
	}
	else if (ch == 't' || ch == 'f')
	{
		if (!ScanBoolean(sc))
		{
			return false;
		}
	}
	else if (ch == '+' || ch == '-' || (ch >= '0' && ch <= '9'))
	{
		if (!ScanNumber(sc))
		{
			return false;
		}
	}
	else
	{
		return false;
	}
	return true;
}